

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O0

void Wln_WriteVer(Wln_Ntk_t *p,char *pFileName)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  char *local_38;
  FILE *pFile;
  char *pFileName_local;
  Wln_Ntk_t *p_local;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Wln_WriteVer(): Cannot open the output file \"%s\".\n",pFileName);
  }
  else {
    pcVar1 = p->pName;
    if (p->pSpec == (char *)0x0) {
      local_38 = "unknown";
    }
    else {
      local_38 = p->pSpec;
    }
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"// Benchmark \"%s\" from file \"%s\" written by ABC on %s\n",pcVar1,local_38,
            pcVar2);
    fprintf(__stream,"\n");
    Wln_WriteTables((FILE *)__stream,p);
    Wln_WriteVerInt((FILE *)__stream,p);
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void Wln_WriteVer( Wln_Ntk_t * p, char * pFileName )
{
    FILE * pFile;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Wln_WriteVer(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Benchmark \"%s\" from file \"%s\" written by ABC on %s\n", p->pName, p->pSpec ? p->pSpec : "unknown", Extra_TimeStamp() );
    fprintf( pFile, "\n" );
    Wln_WriteTables( pFile, p );
//    if ( fAddCos )
//        Wln_WriteAddPos( p );
    Wln_WriteVerInt( pFile, p );
    fprintf( pFile, "\n" );
    fclose( pFile );
}